

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

void __thiscall
ans_fold_encode<1U>::encode_symbol
          (ans_fold_encode<1U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  uint32_t uVar1;
  reference pvVar2;
  uint8_t **in_RCX;
  uint32_t in_EDX;
  ulong *in_RSI;
  long in_RDI;
  uint32_t *out_ptr_u32;
  value_type *e;
  uint32_t mapped_sym;
  
  uVar1 = ans_fold_mapping_and_exceptions<1u>(in_EDX,in_RCX);
  pvVar2 = std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::operator[]
                     ((vector<enc_entry_fold,_std::allocator<enc_entry_fold>_> *)(in_RDI + 0x18),
                      (ulong)uVar1);
  if (pvVar2->sym_upper_bound <= *in_RSI) {
    *(int *)*in_RCX = (int)*in_RSI;
    *in_RCX = *in_RCX + 4;
    *in_RSI = *in_RSI >> 0x20;
  }
  *in_RSI = (*in_RSI / (ulong)pvVar2->freq) * *(long *)(in_RDI + 0x30) +
            *in_RSI % (ulong)pvVar2->freq + (ulong)pvVar2->base;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym
            = ans_fold_mapping_and_exceptions<fidelity>(sym, out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }